

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<DP::SimpleCongruenceClosure::DistinctEntry>::expand
          (Stack<DP::SimpleCongruenceClosure::DistinctEntry> *this)

{
  undefined8 *puVar1;
  DistinctEntry *pDVar2;
  undefined8 uVar3;
  DistinctEntry *pDVar4;
  ulong uVar5;
  long lVar6;
  size_t i;
  size_t sVar7;
  ulong uVar8;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar5 = sVar7 * 0x28;
  if (uVar5 == 0) {
    pDVar4 = (DistinctEntry *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 0x11) {
    pDVar4 = (DistinctEntry *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar5 < 0x19) {
    pDVar4 = (DistinctEntry *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar5 < 0x21) {
    pDVar4 = (DistinctEntry *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar5 < 0x31) {
    pDVar4 = (DistinctEntry *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar5 < 0x41) {
    pDVar4 = (DistinctEntry *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pDVar4 = (DistinctEntry *)::operator_new(uVar5,0x10);
  }
  if (this->_capacity == 0) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0x10;
    uVar8 = 0;
    do {
      pDVar2 = this->_stack;
      *(undefined8 *)((long)pDVar4 + lVar6 + -0x10) = *(undefined8 *)((long)pDVar2 + lVar6 + -0x10);
      puVar1 = (undefined8 *)((long)pDVar4 + lVar6 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pDVar4->_consts)._capacity + lVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pDVar4 + lVar6 + -8) = *(undefined8 *)((long)pDVar2 + lVar6 + -8);
      *(undefined8 *)((long)pDVar2 + lVar6 + -8) = 0;
      *(undefined8 *)((long)&(pDVar4->_consts)._capacity + lVar6) =
           *(undefined8 *)((long)&(pDVar2->_consts)._capacity + lVar6);
      *(undefined8 *)((long)&(pDVar2->_consts)._capacity + lVar6) = 0;
      uVar3 = *(undefined8 *)((long)&(pDVar4->_consts)._stack + lVar6);
      *(undefined8 *)((long)&(pDVar4->_consts)._stack + lVar6) =
           *(undefined8 *)((long)&(pDVar2->_consts)._stack + lVar6);
      *(undefined8 *)((long)&(pDVar2->_consts)._stack + lVar6) = uVar3;
      uVar3 = *(undefined8 *)((long)&pDVar4->_lit + lVar6);
      *(undefined8 *)((long)&pDVar4->_lit + lVar6) = *(undefined8 *)((long)&pDVar2->_lit + lVar6);
      *(undefined8 *)((long)&pDVar2->_lit + lVar6) = uVar3;
      puVar1 = *(undefined8 **)((long)&this->_stack->_lit + lVar6);
      if (puVar1 != (undefined8 *)0x0) {
        uVar5 = *(long *)((long)this->_stack + lVar6 + -8) * 4 + 0xfU & 0xfffffffffffffff0;
        if (uVar5 == 0) {
          *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
        }
        else if (uVar5 < 0x11) {
          *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar1;
        }
        else if (uVar5 < 0x19) {
          *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar1;
        }
        else if (uVar5 < 0x21) {
          *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar1;
        }
        else if (uVar5 < 0x31) {
          *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar1;
        }
        else if (uVar5 < 0x41) {
          *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar1;
        }
        else {
          operator_delete(puVar1,0x10);
        }
      }
      uVar8 = uVar8 + 1;
      uVar5 = this->_capacity;
      lVar6 = lVar6 + 0x28;
    } while (uVar8 < uVar5);
    pDVar2 = this->_stack;
    if (pDVar2 != (DistinctEntry *)0x0) {
      uVar8 = uVar5 * 0x28 + 0xf & 0xfffffffffffffff0;
      if (uVar8 == 0) {
        pDVar2->_lit = (Literal *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pDVar2;
      }
      else if (uVar8 < 0x11) {
        pDVar2->_lit = (Literal *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pDVar2;
      }
      else if (uVar8 < 0x19) {
        pDVar2->_lit = (Literal *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pDVar2;
      }
      else if (uVar8 < 0x21) {
        pDVar2->_lit = (Literal *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pDVar2;
      }
      else if (uVar8 < 0x31) {
        pDVar2->_lit = (Literal *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar2;
      }
      else if (uVar8 < 0x41) {
        pDVar2->_lit = (Literal *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pDVar2;
      }
      else {
        operator_delete(pDVar2,0x10);
        uVar5 = this->_capacity;
      }
    }
  }
  this->_stack = pDVar4;
  this->_cursor = pDVar4 + uVar5;
  this->_end = pDVar4 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }